

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar74;
  uint uVar75;
  int iVar76;
  int iVar77;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  longlong *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int64_t *ptr_06;
  __m128i *palVar78;
  longlong *plVar79;
  long *plVar80;
  uint uVar81;
  longlong lVar82;
  int iVar83;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ulong extraout_RDX_06;
  __m128i *array;
  undefined8 extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  undefined1 *puVar85;
  undefined8 extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  long extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  long extraout_XMM0_Qa_12;
  long lVar86;
  ulong extraout_XMM0_Qa_13;
  longlong extraout_XMM0_Qa_14;
  ulong extraout_XMM0_Qa_15;
  ulong extraout_XMM0_Qa_16;
  undefined8 extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong uVar87;
  longlong extraout_XMM0_Qb_02;
  long lVar88;
  long lVar89;
  undefined8 extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  ulong uVar90;
  longlong extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  long extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  long extraout_XMM0_Qb_12;
  ulong extraout_XMM0_Qb_13;
  longlong extraout_XMM0_Qb_14;
  ulong extraout_XMM0_Qb_15;
  ulong extraout_XMM0_Qb_16;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i a_20;
  __m128i a_21;
  __m128i a_22;
  __m128i a_23;
  __m128i alVar94;
  __m128i alVar95;
  __m128i alVar96;
  __m128i alVar97;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i b_20;
  __m128i b_21;
  __m128i b_22;
  __m128i b_23;
  __m128i b_24;
  __m128i b_25;
  __m128i b_26;
  __m128i b_27;
  __m128i b_28;
  __m128i alVar98;
  __m128i alVar99;
  __m128i alVar100;
  __m128i c;
  __m128i c_00;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  undefined8 in_stack_ffffffffffffec18;
  ulong local_13d0;
  int local_13c4;
  long local_13c0;
  int local_13b4;
  longlong lStack_13a8;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int64_t *l;
  int64_t *s;
  int64_t *m;
  int64_t *t;
  __m128i cond_max;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_64_t h;
  int local_10a0;
  int local_109c;
  int32_t segNum;
  int32_t index;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vPosMask;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  __m128i vOne;
  __m128i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int64_t *boundary;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  longlong lVar84;
  longlong extraout_RDX_07;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_64",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile64).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_64",
            "profile->profile64.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_64",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_64"
            ,"profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_64",
            "s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_64"
            ,"s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_table_scan_profile_sse41_128_64","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_table_scan_profile_sse41_128_64","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len - 1;
    ppVar5 = profile->matrix;
    iVar74 = (iVar1 + 1) / 2;
    iVar83 = (iVar1 + -1) % iVar74;
    uVar75 = ~((iVar1 + -1) / iVar74);
    iVar76 = uVar75 + 2;
    pvVar6 = (profile->profile64).score;
    pvVar7 = (profile->profile64).matches;
    pvVar8 = (profile->profile64).similar;
    if (-open < ppVar5->min) {
      alVar96[1] = (long)open;
    }
    else {
      alVar96[1] = -(long)ppVar5->min;
    }
    matches = alVar96[1] + -0x7fffffffffffffff;
    similar = 0;
    length = 0;
    vNegLimit[1] = 0;
    vMaxM[0] = matches;
    vMaxS[1] = matches;
    vMaxS[0] = matches;
    vMaxL[1] = matches;
    vMaxL[0] = matches;
    vPosMask[1] = matches;
    iVar77 = s1_beg;
    profile_local = (parasail_profile_t *)parasail_result_new_table3(iVar74 * 2,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x2810402;
      uVar81 = 0;
      if (s1_beg != 0) {
        uVar81 = 8;
      }
      *(uint *)&profile_local->field_0xc = uVar81 | *(uint *)&profile_local->field_0xc;
      uVar81 = 0;
      if (s1_end != 0) {
        uVar81 = 0x10;
      }
      *(uint *)&profile_local->field_0xc = uVar81 | *(uint *)&profile_local->field_0xc;
      uVar81 = 0;
      if (s2_beg != 0) {
        uVar81 = 0x4000;
      }
      *(uint *)&profile_local->field_0xc = uVar81 | *(uint *)&profile_local->field_0xc;
      uVar81 = 0;
      if (s2_end != 0) {
        uVar81 = 0x8000;
      }
      *(uint *)&profile_local->field_0xc = uVar81 | *(uint *)&profile_local->field_0xc;
      uVar81 = *(uint *)&profile_local->field_0xc | 0x20000;
      alVar95[1] = (size_t)uVar81;
      *(uint *)&profile_local->field_0xc = uVar81;
      b = parasail_memalign___m128i(0x10,(long)iVar74);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar74);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar74);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr = parasail_memalign___m128i(0x10,(long)iVar74);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar74);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar74);
      b_05 = *parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_05 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_06 = parasail_memalign_int64_t(0x10,(long)(s2Len + 1));
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if ((__m128i *)b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_06 == (int64_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar98[0] = (long)iVar74;
        alVar98[1] = extraout_RDX;
        parasail_memset___m128i(b_03,alVar98,alVar95[1]);
        alVar97[0] = (long)iVar74;
        alVar97[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,alVar97,alVar95[1]);
        alVar99[0] = (long)iVar74;
        alVar99[1] = extraout_RDX_01;
        parasail_memset___m128i((__m128i *)b_05,alVar99,alVar95[1]);
        alVar100[0] = (long)iVar74;
        alVar100[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar100,alVar95[1]);
        alVar94[0] = (long)iVar74;
        alVar94[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar94,alVar95[1]);
        c[0] = (long)iVar74;
        c[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c,alVar95[1]);
        c_00[0] = (ulong)iVar74;
        c_00[1] = extraout_RDX_05;
        array = b_02;
        parasail_memset___m128i(b_02,c_00,alVar95[1]);
        vGapperL[1] = -(long)open;
        vGapper[0] = -(long)open;
        _segNum = 1;
        vGapperL[0] = 1;
        k = iVar74;
        while (k = k + -1, -1 < k) {
          ptr_04[k][0] = vGapperL[1];
          ptr_04[k][1] = vGapper[0];
          alVar95[1] = (long)k * 0x10;
          ptr_05[k][0] = _segNum;
          ptr_05[k][1] = vGapperL[0];
          vGapperL[1] = vGapperL[1] - gap;
          vGapper[0] = vGapper[0] - gap;
          _segNum = _segNum + 1;
          vGapperL[0] = vGapperL[0] + 1;
        }
        local_109c = 0;
        local_13d0 = extraout_RDX_06;
        for (k = 0; k < iVar74; k = k + 1) {
          for (local_10a0 = 0; local_10a0 < 2; local_10a0 = local_10a0 + 1) {
            if (s1_beg == 0) {
              uVar81 = local_10a0 * iVar74 + k;
              local_13d0 = (ulong)uVar81;
              local_13b4 = -(gap * uVar81) - open;
            }
            else {
              local_13b4 = 0;
            }
            local_13c0 = (long)local_13b4;
            if (local_13c0 < -0x8000000000000000) {
              local_13c0 = -0x8000000000000000;
            }
            (&tmp)[local_10a0] = local_13c0;
          }
          alVar95[1] = (long)local_109c * 0x10;
          ptr[local_109c][0] = tmp;
          ptr[local_109c][1] = h.m[0];
          local_109c = local_109c + 1;
        }
        *ptr_06 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_13c4 = -(gap * (k + -1)) - open;
          }
          else {
            local_13c4 = 0;
          }
          local_13d0 = (ulong)local_13c4;
          if ((long)local_13d0 < -0x8000000000000000) {
            local_13d0 = 0x8000000000000000;
          }
          alVar95[1] = (size_t)k;
          ptr_06[alVar95[1]] = local_13d0;
        }
        vMaxM[1] = matches;
        vMaxH[0] = matches;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          vHpS[1] = 0;
          vHpL[1] = 0;
          pvW = (__m128i *)0x0;
          iVar2 = ppVar5->mapper[(byte)s2[s1Len]];
          iVar3 = ppVar5->mapper[(byte)s2[s1Len]];
          c_00[0] = (ulong)s1Len;
          vH_03[0] = (ulong)(byte)s2[c_00[0]];
          iVar4 = ppVar5->mapper[vH_03[0]];
          vHtM[1] = matches - (*ptr_04)[0];
          vHt[0] = matches - (*ptr_04)[1];
          stack0xffffffffffffee58 = ZEXT816(0);
          stack0xffffffffffffee48 = ZEXT816(0);
          stack0xffffffffffffee38 = ZEXT816(0);
          k = 0;
          vHpL[0] = b_05[(long)(iVar74 + -1) * 2];
          vHpS[0] = b_04[iVar74 + -1][0];
          vHpM[0] = b_03[iVar74 + -1][0];
          vHpM[1] = ptr_06[s1Len];
          vHp[0] = ptr[iVar74 + -1][0];
          vF_ext[1] = matches;
          vF[0] = matches;
          while( true ) {
            lVar11 = vHtS[1];
            lVar10 = vHtL[1];
            lVar9 = vF[1];
            if (iVar74 <= k) break;
            lVar9 = ptr[k][0];
            lVar10 = ptr[k][1];
            palVar78 = b_03 + k;
            lVar11 = (*palVar78)[0];
            lVar82 = (*palVar78)[1];
            alVar98 = *palVar78;
            palVar78 = b_04 + k;
            lVar12 = (*palVar78)[0];
            lVar13 = (*palVar78)[1];
            alVar99 = *palVar78;
            plVar79 = b_05 + (long)k * 2;
            palVar78 = (__m128i *)*plVar79;
            lVar84 = plVar79[1];
            auVar93 = *(undefined1 (*) [16])plVar79;
            alVar95 = b_00[k];
            alVar97 = b_01[k];
            alVar100 = b_02[k];
            plVar80 = (long *)((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar74) * 0x10);
            alVar96[1] = *plVar80;
            lVar86 = plVar80[1];
            plVar80 = (long *)((long)pvVar7 + (long)k * 0x10 + (long)(iVar3 * iVar74) * 0x10);
            b_18[1] = *plVar80;
            lVar88 = plVar80[1];
            plVar80 = (long *)((long)pvVar8 + (long)k * 0x10 + (long)(iVar4 * iVar74) * 0x10);
            b_12[1] = *plVar80;
            lVar89 = plVar80[1];
            lVar14 = ptr_04[k][0];
            lVar15 = ptr_04[k][1];
            b_06[1] = (long)k * 0x10;
            lVar16 = ptr_05[k][0];
            lVar17 = ptr_05[k][1];
            a[1] = c_00[0];
            a[0] = (longlong)array;
            b_06[0] = vH_03[0];
            alVar94 = _mm_cmpgt_epi64_rpl(a,b_06);
            b_07[0] = alVar94[1];
            a_00[1] = c_00[0];
            a_00[0] = (longlong)array;
            b_07[1] = b_06[1];
            alVar94 = _mm_max_epi64_rpl(a_00,b_07);
            b_08[0] = alVar94[1];
            auVar51._8_8_ = extraout_XMM0_Qb;
            auVar51._0_8_ = extraout_XMM0_Qa;
            auVar91 = pblendvb((undefined1  [16])alVar95,(undefined1  [16])alVar98,auVar51);
            auVar50._8_8_ = extraout_XMM0_Qb;
            auVar50._0_8_ = extraout_XMM0_Qa;
            auVar92 = pblendvb((undefined1  [16])alVar97,(undefined1  [16])alVar99,auVar50);
            auVar49._8_8_ = extraout_XMM0_Qb;
            auVar49._0_8_ = extraout_XMM0_Qa;
            auVar93 = pblendvb((undefined1  [16])alVar100,auVar93,auVar49);
            vHt[1] = auVar93._0_8_;
            vEL[0] = auVar93._8_8_;
            a_01[1] = c_00[0];
            a_01[0] = (longlong)array;
            b_08[1] = b_06[1];
            alVar95 = _mm_cmpgt_epi64_rpl(a_01,b_08);
            b_09[0] = alVar95[1];
            vH_03[0] = extraout_XMM0_Qa_01 | -(ulong)(vF_ext[1] == vHtM[1] + lVar14);
            uVar87 = extraout_XMM0_Qb_01 | -(ulong)(vF[0] == vHt[0] + lVar15);
            a_02[1] = c_00[0];
            a_02[0] = (longlong)array;
            b_09[1] = b_06[1];
            alVar95 = _mm_max_epi64_rpl(a_02,b_09);
            b_10[0] = alVar95[1];
            auVar48._8_8_ = uVar87;
            auVar48._0_8_ = vH_03[0];
            register0x00001240 = pblendvb(stack0xffffffffffffeeb8,stack0xffffffffffffee58,auVar48);
            auVar47._8_8_ = uVar87;
            auVar47._0_8_ = vH_03[0];
            register0x00001240 = pblendvb(stack0xffffffffffffeea8,stack0xffffffffffffee48,auVar47);
            auVar46._8_8_ = vHtL[0] + lVar17;
            auVar46._0_8_ = vF[1] + lVar16;
            auVar45._8_8_ = uVar87;
            auVar45._0_8_ = vH_03[0];
            register0x00001240 = pblendvb(auVar46,stack0xffffffffffffee38,auVar45);
            b_18[1] = vHpS[1] + b_18[1];
            lVar88 = vHpM[0] + lVar88;
            b_12[1] = vHpL[1] + b_12[1];
            lVar89 = vHpS[0] + lVar89;
            puVar85 = (undefined1 *)((long)*pvW + 1);
            a_03[1] = c_00[0];
            a_03[0] = (longlong)array;
            b_10[1] = b_06[1];
            alVar95 = _mm_cmpgt_epi64_rpl(a_03,b_10);
            b_11[0] = alVar95[1];
            a_04[1] = c_00[0];
            a_04[0] = (longlong)array;
            b_11[1] = b_06[1];
            alVar95 = _mm_max_epi64_rpl(a_04,b_11);
            vH_03[0] = alVar95[1];
            vES[1] = auVar91._0_8_;
            vEM[0] = auVar91._8_8_;
            auVar44._8_8_ = lVar88;
            auVar44._0_8_ = b_18[1];
            auVar43._8_8_ = extraout_XMM0_Qb_03;
            auVar43._0_8_ = extraout_XMM0_Qa_03;
            register0x00001240 = pblendvb(auVar44,auVar91,auVar43);
            vEL[1] = auVar92._0_8_;
            vES[0] = auVar92._8_8_;
            auVar42._8_8_ = lVar89;
            auVar42._0_8_ = b_12[1];
            auVar41._8_8_ = extraout_XMM0_Qb_03;
            auVar41._0_8_ = extraout_XMM0_Qa_03;
            register0x00001240 = pblendvb(auVar42,auVar92,auVar41);
            auVar40._8_8_ = vHpL[0] + 1;
            auVar40._0_8_ = puVar85;
            auVar39._8_8_ = vEL[0] + 1;
            auVar39._0_8_ = vHt[1] + 1;
            auVar38._8_8_ = extraout_XMM0_Qb_03;
            auVar38._0_8_ = extraout_XMM0_Qa_03;
            register0x00001240 = pblendvb(auVar40,auVar39,auVar38);
            b[k][0] = extraout_XMM0_Qa_00;
            b[k][1] = extraout_XMM0_Qb_00;
            b_00[k][0] = vES[1];
            b_00[k][1] = vEM[0];
            b_01[k][0] = vEL[1];
            b_01[k][1] = vES[0];
            b_02[k][0] = vHt[1] + 1;
            b_02[k][1] = vEL[0] + 1;
            ptr[k][0] = vHpM[1] + alVar96[1];
            ptr[k][1] = vHp[0] + lVar86;
            b_03[k][0] = b_18[1];
            b_03[k][1] = lVar88;
            b_04[k][0] = b_12[1];
            b_04[k][1] = lVar89;
            b_05[(long)k * 2] = (longlong)puVar85;
            (b_05 + (long)k * 2)[1] = vHpL[0] + 1;
            k = k + 1;
            pvW = palVar78;
            vHpL[0] = lVar84;
            vHpL[1] = lVar12;
            vHpS[0] = lVar13;
            vHpS[1] = lVar11;
            vHpM[0] = lVar82;
            vHpM[1] = lVar9;
            vHp[0] = lVar10;
            vF_ext[1] = extraout_XMM0_Qa_02;
            vF[0] = extraout_XMM0_Qb_02;
            vHtM[1] = extraout_XMM0_Qa_04;
            vHt[0] = extraout_XMM0_Qb_04;
          }
          auVar54._8_8_ = 0;
          auVar54._0_8_ = vHtS[1];
          stack0xffffffffffffeeb8 = auVar54 << 0x40;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = vHtL[1];
          stack0xffffffffffffeea8 = auVar55 << 0x40;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = vF[1];
          stack0xffffffffffffee98 = auVar56 << 0x40;
          b_12[1] = (long)s1Len;
          alVar96[1] = ptr_06[b_12[1] + 1];
          lVar86 = (*ptr_04)[0];
          b_18[1] = (*ptr_04)[1];
          lVar82 = (*ptr_05)[0];
          lVar88 = (*ptr_05)[1];
          a_05[1] = c_00[0];
          a_05[0] = (longlong)array;
          b_12[0] = vH_03[0];
          alVar95 = _mm_cmpgt_epi64_rpl(a_05,b_12);
          b_13[0] = alVar95[1];
          uVar87 = extraout_XMM0_Qa_05 | -(ulong)(alVar96[1] + lVar86 == vF_ext[1]);
          uVar90 = extraout_XMM0_Qb_05 | -(ulong)(vHtM[1] + b_18[1] == vF[0]);
          a_06[1] = c_00[0];
          a_06[0] = (longlong)array;
          b_13[1] = b_12[1];
          alVar96 = _mm_max_epi64_rpl(a_06,b_13);
          vH_03[0] = alVar96[1];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = lVar11;
          auVar37._8_8_ = uVar90;
          auVar37._0_8_ = uVar87;
          register0x00001240 = pblendvb(stack0xffffffffffffee58,auVar65 << 0x40,auVar37);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = lVar10;
          auVar92._8_8_ = uVar90;
          auVar92._0_8_ = uVar87;
          register0x00001240 = pblendvb(stack0xffffffffffffee48,auVar66 << 0x40,auVar92);
          auVar91._8_8_ = lVar9 + lVar88;
          auVar91._0_8_ = lVar82;
          auVar93._8_8_ = uVar90;
          auVar93._0_8_ = uVar87;
          register0x00001240 = pblendvb(stack0xffffffffffffee38,auVar91,auVar93);
          k = 0;
          vF_ext[1] = extraout_XMM0_Qa_06;
          vF[0] = extraout_XMM0_Qb_06;
          while( true ) {
            lVar13 = vFS[1];
            lVar12 = vFL[1];
            lVar82 = vH[1];
            if (-1 < k) break;
            a_07[1] = c_00[0];
            a_07[0] = (longlong)array;
            b_14[1] = 0;
            b_14[0] = vH_03[0];
            lVar82 = 0;
            alVar96 = _mm_cmpgt_epi64_rpl(a_07,b_14);
            b_15[0] = alVar96[1];
            uVar87 = extraout_XMM0_Qa_07 | -(ulong)(matches == vF_ext[1]);
            uVar90 = extraout_XMM0_Qb_07 | -(ulong)(vF_ext[1] + -iVar74 * gap == vF[0]);
            a_08[1] = c_00[0];
            a_08[0] = (longlong)array;
            b_15[1] = lVar82;
            alVar96 = _mm_max_epi64_rpl(a_08,b_15);
            vH_03[0] = alVar96[1];
            auVar57._8_8_ = 0;
            auVar57._0_8_ = vFS[1];
            auVar36._8_8_ = uVar90;
            auVar36._0_8_ = uVar87;
            register0x00001240 = pblendvb(stack0xffffffffffffee58,auVar57 << 0x40,auVar36);
            auVar58._8_8_ = 0;
            auVar58._0_8_ = vFL[1];
            auVar35._8_8_ = uVar90;
            auVar35._0_8_ = uVar87;
            register0x00001240 = pblendvb(stack0xffffffffffffee48,auVar58 << 0x40,auVar35);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = vH[1] + iVar74;
            auVar34._8_8_ = uVar90;
            auVar34._0_8_ = uVar87;
            register0x00001240 = pblendvb(stack0xffffffffffffee38,auVar67 << 0x40,auVar34);
            k = k + 1;
            vF_ext[1] = extraout_XMM0_Qa_08;
            vF[0] = extraout_XMM0_Qb_08;
          }
          auVar59._8_8_ = 0;
          auVar59._0_8_ = vFS[1];
          stack0xffffffffffffee58 = auVar59 << 0x40;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = vFL[1];
          stack0xffffffffffffee48 = auVar60 << 0x40;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = vH[1];
          stack0xffffffffffffee38 = auVar61 << 0x40;
          a_09[1] = c_00[0];
          a_09[0] = (longlong)array;
          b_16[1] = 0;
          b_16[0] = vH_03[0];
          lVar84 = 0;
          alVar96 = _mm_cmpgt_epi64_rpl(a_09,b_16);
          b_17[0] = alVar96[1];
          a_10[1] = c_00[0];
          a_10[0] = (longlong)array;
          b_17[1] = lVar84;
          alVar96 = _mm_max_epi64_rpl(a_10,b_17);
          lVar84 = alVar96[1];
          auVar71._8_8_ = 0;
          auVar71._0_8_ = lVar11;
          auVar68._8_8_ = 0;
          auVar68._0_8_ = lVar13;
          auVar33._8_8_ = extraout_XMM0_Qb_09;
          auVar33._0_8_ = extraout_XMM0_Qa_09;
          register0x00001240 = pblendvb(auVar71 << 0x40,auVar68 << 0x40,auVar33);
          auVar72._8_8_ = 0;
          auVar72._0_8_ = lVar10;
          auVar69._8_8_ = 0;
          auVar69._0_8_ = lVar12;
          auVar32._8_8_ = extraout_XMM0_Qb_09;
          auVar32._0_8_ = extraout_XMM0_Qa_09;
          register0x00001240 = pblendvb(auVar72 << 0x40,auVar69 << 0x40,auVar32);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = lVar9;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = lVar82;
          auVar31._8_8_ = extraout_XMM0_Qb_09;
          auVar31._0_8_ = extraout_XMM0_Qa_09;
          register0x00001240 = pblendvb(auVar73 << 0x40,auVar70 << 0x40,auVar31);
          for (k = 0; k < iVar74; k = k + 1) {
            alVar96[1] = ptr[k][0];
            lVar86 = ptr[k][1];
            alVar95 = b_03[k];
            alVar98 = b_04[k];
            auVar93 = *(undefined1 (*) [16])(b_05 + (long)k * 2);
            alVar97 = b_00[k];
            alVar99 = b_01[k];
            b_18[1] = (long)k * 0x10;
            alVar100 = b_02[k];
            a_11[1] = c_00[0];
            a_11[0] = (longlong)array;
            b_18[0] = lVar84;
            alVar94 = _mm_max_epi64_rpl(a_11,b_18);
            b_19[0] = alVar94[1];
            a_12[1] = c_00[0];
            a_12[0] = (longlong)array;
            b_19[1] = b_18[1];
            alVar94 = _mm_cmpgt_epi64_rpl(a_12,b_19);
            b_20[0] = alVar94[1];
            auVar30._8_8_ = extraout_XMM0_Qb_11;
            auVar30._0_8_ = extraout_XMM0_Qa_11;
            register0x00001240 = pblendvb(stack0xffffffffffffee58,stack0xffffffffffffee18,auVar30);
            auVar29._8_8_ = extraout_XMM0_Qb_11;
            auVar29._0_8_ = extraout_XMM0_Qa_11;
            register0x00001240 = pblendvb(stack0xffffffffffffee48,stack0xffffffffffffee08,auVar29);
            auVar28._8_8_ = extraout_XMM0_Qb_11;
            auVar28._0_8_ = extraout_XMM0_Qa_11;
            auVar91 = pblendvb(stack0xffffffffffffee38,stack0xffffffffffffedf8,auVar28);
            vH[1] = auVar91._0_8_;
            vFL[0] = auVar91._8_8_;
            vH[1] = vH[1] + 1;
            vFL[0] = vFL[0] + 1;
            a_13[1] = c_00[0];
            a_13[0] = (longlong)array;
            b_20[1] = b_18[1];
            alVar94 = _mm_max_epi64_rpl(a_13,b_20);
            b_21[0] = alVar94[1];
            a_14[1] = c_00[0];
            a_14[0] = (longlong)array;
            b_21[1] = b_18[1];
            alVar94 = _mm_max_epi64_rpl(a_14,b_21);
            alVar96[0] = alVar94[1];
            alVar96[1] = -(ulong)(extraout_XMM0_Qa_12 == alVar96[1]);
            b_18[1] = -(ulong)(extraout_XMM0_Qb_12 == lVar86);
            lVar86 = -(ulong)(extraout_XMM0_Qa_12 == extraout_XMM0_Qa_10);
            lVar88 = -(ulong)(extraout_XMM0_Qb_12 == extraout_XMM0_Qb_10);
            auVar27._8_8_ = lVar88;
            auVar27._0_8_ = lVar86;
            auVar91 = pblendvb((undefined1  [16])alVar97,register0x00001240,auVar27);
            auVar26._8_8_ = b_18[1];
            auVar26._0_8_ = alVar96[1];
            register0x00001240 = pblendvb(auVar91,(undefined1  [16])alVar95,auVar26);
            auVar25._8_8_ = lVar88;
            auVar25._0_8_ = lVar86;
            auVar91 = pblendvb((undefined1  [16])alVar99,register0x00001240,auVar25);
            auVar24._8_8_ = b_18[1];
            auVar24._0_8_ = alVar96[1];
            register0x00001240 = pblendvb(auVar91,(undefined1  [16])alVar98,auVar24);
            auVar23._8_8_ = vFL[0];
            auVar23._0_8_ = vH[1];
            auVar22._8_8_ = lVar88;
            auVar22._0_8_ = lVar86;
            auVar91 = pblendvb((undefined1  [16])alVar100,auVar23,auVar22);
            auVar21._8_8_ = b_18[1];
            auVar21._0_8_ = alVar96[1];
            register0x00001240 = pblendvb(auVar91,auVar93,auVar21);
            ptr[k][0] = extraout_XMM0_Qa_12;
            ptr[k][1] = extraout_XMM0_Qb_12;
            b_03[k][0] = vHS[1];
            b_03[k][1] = vHM[0];
            b_04[k][0] = vHL[1];
            b_04[k][1] = vHS[0];
            alVar96[1] = (long)k * 0x10;
            b_05[(long)k * 2] = vHp[1];
            (b_05 + (long)k * 2)[1] = vHL[0];
            a_15[1] = c_00[0];
            a_15[0] = (longlong)array;
            alVar95 = _mm_min_epi64_rpl(a_15,alVar96);
            b_22[0] = alVar95[1];
            a_16[1] = c_00[0];
            a_16[0] = (longlong)array;
            b_22[1] = alVar96[1];
            alVar95 = _mm_max_epi64_rpl(a_16,b_22);
            b_23[0] = alVar95[1];
            a_17[1] = c_00[0];
            a_17[0] = (longlong)array;
            b_23[1] = alVar96[1];
            alVar95 = _mm_max_epi64_rpl(a_17,b_23);
            b_24[0] = alVar95[1];
            a_18[1] = c_00[0];
            a_18[0] = (longlong)array;
            b_24[1] = alVar96[1];
            alVar95 = _mm_max_epi64_rpl(a_18,b_24);
            b_25[0] = alVar95[1];
            a_19[1] = c_00[0];
            a_19[0] = (longlong)array;
            b_25[1] = alVar96[1];
            _mm_max_epi64_rpl(a_19,b_25);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar74;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                             &profile_local->matrix)->trace->trace_del_table,vH_00,s1Len,s2Len,
                            iVar77,(int32_t)in_stack_ffffffffffffec18);
            vH_01[0] = (ulong)(uint)k;
            vH_01[1]._0_4_ = iVar74;
            vH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 8),
                            vH_01,s1Len,s2Len,iVar77,(int32_t)in_stack_ffffffffffffec18);
            vH_02[0] = (ulong)(uint)k;
            vH_02[1]._0_4_ = iVar74;
            vH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 0x10),
                            vH_02,s1Len,s2Len,iVar77,(int32_t)in_stack_ffffffffffffec18);
            array = *(__m128i **)
                     ((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix
                            )->trace->trace_del_table + 0x18);
            vH_03[0] = (ulong)(uint)k;
            vH_03[1]._0_4_ = iVar74;
            vH_03[1]._4_4_ = 0;
            arr_store_si128((int *)array,vH_03,s1Len,s2Len,iVar77,(int32_t)in_stack_ffffffffffffec18
                           );
            lVar84 = extraout_RDX_07;
            c_00[0] = vH_03[0];
          }
          alVar96 = b_03[iVar83];
          alVar98 = b_04[iVar83];
          alVar95[1] = (long)iVar83 * 0x10;
          auVar93 = *(undefined1 (*) [16])(b_05 + (long)iVar83 * 2);
          a_20[1] = c_00[0];
          a_20[0] = (longlong)array;
          alVar95[0] = lVar84;
          alVar97 = _mm_cmpgt_epi64_rpl(a_20,alVar95);
          b_26[0] = alVar97[1];
          a_21[1] = c_00[0];
          a_21[0] = (longlong)array;
          b_26[1] = alVar95[1];
          alVar97 = _mm_max_epi64_rpl(a_21,b_26);
          local_13d0 = alVar97[1];
          auVar20._8_8_ = extraout_XMM0_Qb_13;
          auVar20._0_8_ = extraout_XMM0_Qa_13;
          register0x00001240 = pblendvb(stack0xffffffffffffeff8,(undefined1  [16])alVar96,auVar20);
          auVar19._8_8_ = extraout_XMM0_Qb_13;
          auVar19._0_8_ = extraout_XMM0_Qa_13;
          register0x00001240 = pblendvb(stack0xffffffffffffefe8,(undefined1  [16])alVar98,auVar19);
          auVar18._8_8_ = extraout_XMM0_Qb_13;
          auVar18._0_8_ = extraout_XMM0_Qa_13;
          register0x00001240 = pblendvb(stack0xffffffffffffefd8,auVar93,auVar18);
          vH_03[0] = -(ulong)(uVar75 == 0xfffffffe) & extraout_XMM0_Qb_13;
          auVar53._8_8_ = vH_03[0];
          auVar53._0_8_ = -(ulong)(iVar76 == 1) & extraout_XMM0_Qa_13;
          if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar53 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar53 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar53 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar53 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (vH_03[0] >> 7 & 1) != 0) || (vH_03[0] >> 0xf & 1) != 0) ||
                  (vH_03[0] >> 0x17 & 1) != 0) || (vH_03[0] >> 0x1f & 1) != 0) ||
                (vH_03[0] >> 0x27 & 1) != 0) || (vH_03[0] >> 0x2f & 1) != 0) ||
              (vH_03[0] >> 0x37 & 1) != 0) || (long)vH_03[0] < 0) {
            matrix._0_4_ = s1Len;
          }
          vMaxM[1] = extraout_XMM0_Qa_14;
          vMaxH[0] = extraout_XMM0_Qb_14;
        }
        if (s2_end != 0) {
          end_query = 0;
          while( true ) {
            if (iVar76 <= end_query) break;
            vMaxH[0] = vMaxM[1];
            vMaxM[1] = 0;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = vMaxS[1];
            stack0xffffffffffffeff8 = auVar62 << 0x40;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = vMaxL[1];
            stack0xffffffffffffefe8 = auVar63 << 0x40;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = vPosMask[1];
            stack0xffffffffffffefd8 = auVar64 << 0x40;
            end_query = end_query + 1;
          }
          matches = vMaxH[0];
          similar = vMaxM[0];
          length = vMaxS[0];
          vNegLimit[1] = vMaxL[0];
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          k = 0;
          _temp = b_05;
          l = *b_04;
          s = *b_03;
          m = *ptr;
          while( true ) {
            if (iVar74 * 2 <= k) break;
            uVar75 = (k % 2) * iVar74;
            local_13d0 = (ulong)uVar75;
            iVar77 = k / 2 + uVar75;
            if (iVar77 < iVar1) {
              if (matches < *m) {
                matches = *m;
                matrix._0_4_ = s2Len - 1;
                similar = *s;
                length = *l;
                vNegLimit[1] = *_temp;
                matrix._4_4_ = iVar77;
              }
              else if (((*m == matches) &&
                       (alVar95[1] = (size_t)(s2Len - 1U), (uint)matrix == s2Len - 1U)) &&
                      (iVar77 < matrix._4_4_)) {
                similar = *s;
                length = *l;
                vNegLimit[1] = *_temp;
                matrix._4_4_ = iVar77;
              }
            }
            k = k + 1;
            m = m + 1;
            s = s + 1;
            l = l + 1;
            _temp = _temp + 1;
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vHM_1[1] = ptr[iVar83][0];
          vH_1[0] = ptr[iVar83][1];
          vHS_1[1] = b_03[iVar83][0];
          vHM_1[0] = b_03[iVar83][1];
          vHL_1[1] = b_04[iVar83][0];
          vHS_1[0] = b_04[iVar83][1];
          alVar95[1] = (long)iVar83 * 0x10;
          lStack_13a8 = b_05[(long)iVar83 * 2];
          vHL_1[0] = (b_05 + (long)iVar83 * 2)[1];
          for (end_query = 0; lVar11 = vHM_1[1], lVar10 = vHS_1[1], lVar9 = vHL_1[1],
              end_query < iVar76; end_query = end_query + 1) {
            vHM_1[1] = 0;
            vH_1[0] = lVar11;
            vHS_1[1] = 0;
            vHM_1[0] = lVar10;
            vHL_1[1] = 0;
            vHS_1[0] = lVar9;
            vHL_1[0] = lStack_13a8;
            lStack_13a8 = 0;
          }
          matrix._0_4_ = s2Len - 1;
          matrix._4_4_ = iVar1 + -1;
          matches._0_4_ = (int)vH_1[0];
          similar._0_4_ = (int)vHM_1[0];
          length._0_4_ = (int)vHS_1[0];
          vNegLimit[1]._0_4_ = (int)vHL_1[0];
        }
        a_22[1] = c_00[0];
        a_22[0] = (longlong)array;
        b_27[1] = alVar95[1];
        b_27[0] = local_13d0;
        alVar96 = _mm_cmplt_epi64_rpl(a_22,b_27);
        b_28[0] = alVar96[1];
        a_23[1] = c_00[0];
        a_23[0] = (longlong)array;
        b_28[1] = alVar95[1];
        c_00[0] = extraout_XMM0_Qa_15;
        _mm_cmpgt_epi64_rpl(a_23,b_28);
        vH_03[0] = extraout_XMM0_Qb_15 | extraout_XMM0_Qb_16;
        auVar52._8_8_ = vH_03[0];
        auVar52._0_8_ = c_00[0] | extraout_XMM0_Qa_16;
        if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar52 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar52 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar52 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar52 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar52 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (vH_03[0] >> 7 & 1) != 0) || (vH_03[0] >> 0xf & 1) != 0) ||
                (vH_03[0] >> 0x17 & 1) != 0) || (vH_03[0] >> 0x1f & 1) != 0) ||
              (vH_03[0] >> 0x27 & 1) != 0) || (vH_03[0] >> 0x2f & 1) != 0) ||
            (vH_03[0] >> 0x37 & 1) != 0) || (long)vH_03[0] < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          matches._0_4_ = 0;
          similar._0_4_ = 0;
          length._0_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)matches;
        *(int *)((long)&profile_local->s1 + 4) = matrix._4_4_;
        profile_local->s1Len = (uint)matrix;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->matches =
             (int)similar;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             (int)length;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)vNegLimit[1];
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(ptr);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
            vMaxH = _mm_max_epi64_rpl(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
            vMaxM = _mm_slli_si128(vMaxM, 8);
            vMaxS = _mm_slli_si128(vMaxS, 8);
            vMaxL = _mm_slli_si128(vMaxL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
        length = (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int64_t *m = (int64_t*)pvHM;
        int64_t *s = (int64_t*)pvHS;
        int64_t *l = (int64_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}